

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::iterate
          (BinaryAtomicOperationCase *this)

{
  RenderContext *renderContext;
  _func_int ***ppp_Var1;
  ostringstream *poVar2;
  ChannelType CVar3;
  TextureType TVar4;
  AtomicOperation AVar5;
  AtomicOperationCaseType AVar6;
  AtomicOperationCaseType AVar7;
  Context *log;
  bool bVar8;
  bool bVar9;
  GLuint num_groups_z;
  int iVar10;
  GLenum target;
  int i_1;
  int iVar11;
  deUint32 dVar12;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  bool *pbVar15;
  size_t sVar16;
  long *plVar17;
  undefined8 *puVar18;
  TextureFormat *pTVar19;
  undefined8 uVar20;
  ImageLayerVerifier *verifyLayer;
  int i;
  long lVar21;
  long *plVar22;
  size_type *psVar23;
  undefined8 *puVar24;
  pointer *pppTVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  ulong *puVar27;
  char *pcVar28;
  TextureFormat *extraout_RDX;
  TextureFormat *extraout_RDX_00;
  TextureFormat *extraout_RDX_01;
  TextureFormat *extraout_RDX_02;
  TextureFormat *extraout_RDX_03;
  TextureFormat *extraout_RDX_04;
  RenderContext *renderContext_00;
  bool *pbVar29;
  char *__s;
  TextureFormat TVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  RenderContext RVar32;
  _func_int **pp_Var33;
  undefined1 isSampler;
  deUint32 dVar34;
  Functional *pFVar35;
  int x;
  GLuint z;
  TextureFormat TVar36;
  bool *pbVar37;
  bool bVar38;
  ImageLayerVerifier local_7e8;
  GLuint local_7e0;
  bool *local_7d8;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  TextureFormat local_790;
  TextureFormat local_788;
  _func_int **local_780;
  TextureFormat TStack_778;
  string glslVersionDeclaration;
  string atomicInvocation;
  pointer *local_730;
  pointer local_728;
  pointer local_720;
  pointer ppTStack_718;
  Context *local_710;
  TextureFormat local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  Functional *local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  _Alloc_hider local_6b8;
  long local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  TextureFormat local_698;
  value_type local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  TextureFormat local_650;
  TextureFormat local_648;
  long local_640;
  TextureFormat TStack_638;
  ulong *local_630;
  long local_628;
  ulong local_620;
  undefined4 uStack_618;
  undefined4 uStack_614;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  CallLogWrapper glLog;
  long *local_5d8;
  long local_5d0;
  long local_5c8;
  long lStack_5c0;
  _func_int ***local_5b8;
  long local_5b0;
  _func_int **local_5a8;
  undefined8 uStack_5a0;
  string atomicCoord;
  RenderContext *local_578;
  long local_570;
  RenderContext local_568;
  undefined8 uStack_560;
  GLenum local_554;
  ulong *local_550;
  long local_548;
  ulong local_540;
  long lStack_538;
  ulong *local_530;
  long local_528;
  ulong local_520 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  long *local_4f0;
  undefined8 local_4e8;
  long local_4e0;
  undefined8 uStack_4d8;
  TextureFormat *local_4d0;
  string atomicArgExpr;
  long *local_4a8 [2];
  long local_498 [2];
  string colorVecTypeName;
  string local_468;
  string local_448;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  Texture returnValueTexture;
  Texture endResultTexture;
  string invocationCoord;
  IVec4 initial;
  pointer local_388;
  pointer ppSStack_380;
  ios_base local_328 [8];
  ios_base local_320 [32];
  ChannelOrder local_300;
  bool local_2d8;
  ulong local_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  LayeredImage imageData;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_b0;
  undefined1 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar35 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = (Context *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar11 = (*(*(_func_int ***)pFVar35)[3])(pFVar35);
  local_710 = log;
  glu::CallLogWrapper::CallLogWrapper
            (&glLog,(Functions *)CONCAT44(extraout_var,iVar11),(TestLog *)log);
  dVar12 = glu::getInternalFormat(this->m_format);
  local_218 = (ulong)dVar12;
  uVar13 = (ulong)this->m_imageType;
  local_554 = 0xffffffff;
  if (uVar13 < 8) {
    local_554 = *(GLenum *)(&DAT_01c9d058 + uVar13 * 4);
  }
  switch(uVar13) {
  case 0:
  case 1:
    local_7e8._vptr_ImageLayerVerifier = (_func_int **)0x4000000040;
    goto LAB_014b04be;
  case 2:
  case 3:
    local_7e8._vptr_ImageLayerVerifier = (_func_int **)0x4000000040;
    local_7e0 = 8;
    break;
  default:
    local_7e0 = 0xffffffff;
    local_7e8._vptr_ImageLayerVerifier = (_func_int **)&DAT_ffffffffffffffff;
    break;
  case 7:
    local_7e8._vptr_ImageLayerVerifier = (_func_int **)0x100000040;
LAB_014b04be:
    local_7e0 = 1;
  }
  num_groups_z = 6;
  if (this->m_imageType != TEXTURETYPE_CUBE) {
    num_groups_z = local_7e0;
  }
  CVar3 = (this->m_format).type;
  bVar38 = (CVar3 & ~SNORM_INT16) != UNSIGNED_INT8;
  iVar11 = (*(*(_func_int ***)pFVar35)[3])(pFVar35);
  pOVar14 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTextureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar11),
             pOVar14);
  iVar11 = (*(*(_func_int ***)pFVar35)[3])(pFVar35);
  pOVar14 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTextureBuf.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar11),pOVar14);
  iVar11 = (*(*(_func_int ***)pFVar35)[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar11),
             pOVar14);
  iVar11 = (*(*(_func_int ***)pFVar35)[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar11),
             pOVar14);
  glLog.m_enableLog = true;
  poVar2 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_710;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,") to act as the target of atomic operations",0x2b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_320);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    poVar2 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_710;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_320);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    poVar2 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_710;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a texture (name ",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               ") to which the intermediate return values of the atomic operation are stored",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_320);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      poVar2 = (ostringstream *)(initial.m_data + 2);
      initial.m_data._0_8_ = local_710;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_320);
    }
  }
  local_4d0 = &this->m_format;
  iVar10 = (int)local_7e8._vptr_ImageLayerVerifier;
  local_7d8 = (bool *)CONCAT44(local_7d8._4_4_,local_7e8._vptr_ImageLayerVerifier._4_4_);
  LayeredImage::LayeredImage
            (&imageData,this->m_imageType,local_4d0,(int)local_7e8._vptr_ImageLayerVerifier,
             local_7e8._vptr_ImageLayerVerifier._4_4_,local_7e0);
  iVar11 = -1;
  if ((ulong)this->m_operation < 7) {
    iVar11 = *(int *)(&DAT_01c9b244 + (ulong)this->m_operation * 4);
  }
  lVar21 = 0;
  do {
    initial.m_data[lVar21] = iVar11;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 4);
  local_708 = (TextureFormat)this;
  local_6e0 = pFVar35;
  if (0 < (int)num_groups_z) {
    z = 0;
    do {
      if (0 < (int)local_7d8) {
        iVar11 = 0;
        do {
          if (0 < iVar10) {
            x = 0;
            do {
              Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                        ((LayeredImage *)&imageData,x,iVar11,z,&initial);
              x = x + 1;
            } while (iVar10 != x);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != (int)local_7d8);
      }
      z = z + 1;
    } while (z != num_groups_z);
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  target = local_554;
  pFVar35 = local_6e0;
  TVar36 = local_708;
  glu::CallLogWrapper::glBindTexture(&glLog,local_554,endResultTexture.super_ObjectWrapper.m_object)
  ;
  setTexParameteri(&glLog,target);
  poVar2 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_710;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Filling end-result texture with initial pattern (initial value ",
             0x42);
  iVar11 = -1;
  if ((ulong)*(AtomicOperation *)((long)TVar36 + 0x84) < 7) {
    iVar11 = *(int *)(&DAT_01c9b244 + (ulong)*(AtomicOperation *)((long)TVar36 + 0x84) * 4);
  }
  std::ostream::operator<<(poVar2,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_320);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  dVar34 = (deUint32)local_218;
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar34);
  iVar11 = (*(*(_func_int ***)pFVar35)[3])(pFVar35);
  dVar12 = (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0x800))();
  glu::checkError(dVar12,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x7c0);
  if (*(AtomicOperationCaseType *)((long)TVar36 + 0x88) == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
  {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,target,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,target);
    poVar2 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_710;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Setting storage of return-value texture",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_320);
    TVar36 = local_708;
    TVar4 = *(TextureType *)((long)local_708 + 0x80);
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[0] = (uint)(TVar4 == TEXTURETYPE_CUBE) * 4 + 1;
    imageData.m_size.m_data[1] = 1;
    initial.m_data[0] = 0;
    initial.m_data[1] = 0;
    initial.m_data._8_8_ = (ulong)(uint)initial.m_data[3] << 0x20;
    lVar21 = 0;
    do {
      initial.m_data[lVar21] =
           imageData.m_size.m_data[lVar21 + -1] *
           *(int *)((long)&local_7e8._vptr_ImageLayerVerifier + lVar21 * 4);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    setTextureStorage(&glLog,TVar4,dVar34,(IVec3 *)&initial,
                      returnValueTextureBuf.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar34);
    iVar11 = (*(*(_func_int ***)pFVar35)[3])(pFVar35);
    dVar12 = (**(code **)(CONCAT44(extraout_var_05,iVar11) + 0x800))();
    glu::checkError(dVar12,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,2000);
  }
  pbVar15 = (bool *)0x1c8efb1;
  pbVar37 = glcts::fixed_sample_locations_values + 1;
  if (2 < CVar3 - SIGNED_INT8) {
    pbVar15 = glcts::fixed_sample_locations_values + 1;
  }
  pbVar29 = (bool *)0x1b23424;
  if (CVar3 != UNSIGNED_INT32 && bVar38) {
    pbVar29 = pbVar15;
  }
  initial.m_data._0_8_ = &local_388;
  sVar16 = strlen(pbVar29);
  std::__cxx11::string::_M_construct<char_const*>((string *)&initial,pbVar29,pbVar29 + sVar16);
  plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
  colorVecTypeName._M_dataplus._M_p = (pointer)&colorVecTypeName.field_2;
  psVar23 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar23) {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar23;
    colorVecTypeName.field_2._8_8_ = plVar17[3];
  }
  else {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar23;
    colorVecTypeName._M_dataplus._M_p = (pointer)*plVar17;
  }
  colorVecTypeName._M_string_length = plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  if ((pointer *)initial.m_data._0_8_ != &local_388) {
    operator_delete((void *)initial.m_data._0_8_,(long)local_388 + 1);
  }
  TVar4 = *(TextureType *)((long)TVar36 + 0x80);
  paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)TVar4;
  pFVar35 = (Functional *)CONCAT71((int7)((ulong)&local_388 >> 8),TVar4 == TEXTURETYPE_BUFFER);
  iVar11 = (int)local_7e8._vptr_ImageLayerVerifier;
  if (TVar4 == TEXTURETYPE_BUFFER) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_328);
    puVar18 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_5d8,0,(char *)0x0,0x1c9c05f)
    ;
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar23 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar23) {
      atomicCoord.field_2._M_allocated_capacity = *psVar23;
      atomicCoord.field_2._8_8_ = puVar18[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar23;
      atomicCoord._M_dataplus._M_p = (pointer)*puVar18;
    }
    atomicCoord._M_string_length = puVar18[1];
    *puVar18 = psVar23;
    bVar9 = false;
LAB_014b0fc8:
    bVar8 = false;
  }
  else {
    if (TVar4 == TEXTURETYPE_2D) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
      std::ostream::operator<<(&initial,iVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
      std::ios_base::~ios_base(local_328);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,0x1c9c059);
      local_5d8 = &local_5c8;
      plVar22 = plVar17 + 2;
      if ((long *)*plVar17 == plVar22) {
        local_5c8 = *plVar22;
        lStack_5c0 = plVar17[3];
      }
      else {
        local_5c8 = *plVar22;
        local_5d8 = (long *)*plVar17;
      }
      local_5d0 = plVar17[1];
      *plVar17 = (long)plVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_5d8);
      atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
      psVar23 = puVar18 + 2;
      if ((size_type *)*puVar18 == psVar23) {
        atomicCoord.field_2._M_allocated_capacity = *psVar23;
        atomicCoord.field_2._8_8_ = puVar18[3];
      }
      else {
        atomicCoord.field_2._M_allocated_capacity = *psVar23;
        atomicCoord._M_dataplus._M_p = (pointer)*puVar18;
      }
      atomicCoord._M_string_length = puVar18[1];
      *puVar18 = psVar23;
      bVar9 = true;
      goto LAB_014b0fc8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_328);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,0x1c9c065);
    local_5d8 = &local_5c8;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_5c8 = *plVar22;
      lStack_5c0 = plVar17[3];
    }
    else {
      local_5c8 = *plVar22;
      local_5d8 = (long *)*plVar17;
    }
    local_5d0 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_5d8);
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar23 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar23) {
      atomicCoord.field_2._M_allocated_capacity = *psVar23;
      atomicCoord.field_2._8_8_ = puVar18[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar23;
      atomicCoord._M_dataplus._M_p = (pointer)*puVar18;
    }
    atomicCoord._M_string_length = puVar18[1];
    *puVar18 = psVar23;
    bVar8 = true;
    bVar9 = false;
  }
  puVar18[1] = 0;
  *(char *)psVar23 = '\0';
  if (bVar8) {
    if (local_5d8 != &local_5c8) {
      operator_delete(local_5d8,local_5c8 + 1);
    }
    if (local_4a8[0] != local_498) {
      operator_delete(local_4a8[0],local_498[0] + 1);
    }
  }
  TVar36 = local_708;
  if (bVar9) {
    if (local_5d8 != &local_5c8) {
      operator_delete(local_5d8,local_5c8 + 1);
    }
    if (local_4a8[0] != local_498) {
      operator_delete(local_4a8[0],local_498[0] + 1);
    }
  }
  if ((TVar4 == TEXTURETYPE_BUFFER) && (local_5d8 != &local_5c8)) {
    operator_delete(local_5d8,local_5c8 + 1);
  }
  pcVar28 = "ivec3(gx, gy, gz)";
  if (*(TextureType *)((long)TVar36 + 0x80) == TEXTURETYPE_2D) {
    pcVar28 = "ivec2(gx, gy)";
  }
  __s = "gx";
  if (*(TextureType *)((long)TVar36 + 0x80) != TEXTURETYPE_BUFFER) {
    __s = pcVar28;
  }
  invocationCoord._M_dataplus._M_p = (pointer)&invocationCoord.field_2;
  sVar16 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&invocationCoord,__s,__s + sVar16);
  pbVar15 = (bool *)0x1b1a1c8;
  if (CVar3 - SIGNED_INT8 < 3) {
    pbVar15 = glcts::fixed_sample_locations_values + 1;
  }
  pbVar29 = (bool *)0x1ae4d30;
  if (CVar3 != UNSIGNED_INT32 && bVar38) {
    pbVar29 = pbVar15;
  }
  AVar5 = *(AtomicOperation *)((long)TVar36 + 0x84);
  TVar30.type = SNORM_INT8;
  TVar30.order = AVar5;
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"gx","");
  local_650 = (TextureFormat)&local_640;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"gy","");
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"gz","");
  if (AVar5 < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_700,"(",&local_610);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_700);
    puVar24 = puVar18 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_6d8.field_2._M_allocated_capacity = *puVar24;
      local_6d8.field_2._8_8_ = puVar18[3];
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    }
    else {
      local_6d8.field_2._M_allocated_capacity = *puVar24;
      local_6d8._M_dataplus._M_p = (pointer)*puVar18;
    }
    local_6d8._M_string_length = puVar18[1];
    *puVar18 = puVar24;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    local_7d8 = pbVar29;
    pTVar19 = (TextureFormat *)
              std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_610._M_dataplus._M_p);
    local_790 = (TextureFormat)&local_780;
    TVar36 = (TextureFormat)(pTVar19 + 2);
    if (*pTVar19 == TVar36) {
      local_780 = *(_func_int ***)TVar36;
      TStack_778 = pTVar19[3];
    }
    else {
      local_780 = *(_func_int ***)TVar36;
      local_790 = *pTVar19;
    }
    local_788 = pTVar19[1];
    *pTVar19 = TVar36;
    pTVar19[1].order = R;
    pTVar19[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar19[2].order = R;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_790);
    local_730 = &local_720;
    pppTVar25 = (pointer *)(puVar18 + 2);
    if ((pointer *)*puVar18 == pppTVar25) {
      local_720 = *pppTVar25;
      ppTStack_718 = (pointer)puVar18[3];
    }
    else {
      local_720 = *pppTVar25;
      local_730 = (pointer *)*puVar18;
    }
    local_728 = (pointer)puVar18[1];
    *puVar18 = pppTVar25;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_730,(ulong)local_650);
    glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar23;
      glslVersionDeclaration.field_2._8_8_ = plVar17[3];
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar23;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar17;
    }
    glslVersionDeclaration._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageTypeStr.field_2._8_8_ = plVar17[3];
      shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
    }
    else {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageTypeStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&shaderImageTypeStr,(ulong)local_650);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageFormatStr.field_2._8_8_ = plVar17[3];
      shaderImageFormatStr._M_dataplus._M_p = (pointer)&shaderImageFormatStr.field_2;
    }
    else {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageFormatStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageFormatStr);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      atomicInvocation.field_2._M_allocated_capacity = *psVar23;
      atomicInvocation.field_2._8_8_ = plVar17[3];
      atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
    }
    else {
      atomicInvocation.field_2._M_allocated_capacity = *psVar23;
      atomicInvocation._M_dataplus._M_p = (pointer)*plVar17;
    }
    atomicInvocation._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    pTVar19 = (TextureFormat *)
              std::__cxx11::string::_M_append
                        ((char *)&atomicInvocation,(ulong)local_670._M_dataplus._M_p);
    TVar36 = (TextureFormat)(pTVar19 + 2);
    if (*pTVar19 == TVar36) {
      local_690._M_string_length = *(size_type *)TVar36;
      local_690.field_2._M_allocated_capacity = (size_type)pTVar19[3];
      local_698 = (TextureFormat)&local_690._M_string_length;
    }
    else {
      local_690._M_string_length = *(size_type *)TVar36;
      local_698 = *pTVar19;
    }
    local_690._M_dataplus._M_p = *(pointer *)(pTVar19 + 1);
    *pTVar19 = TVar36;
    pTVar19[1].order = R;
    pTVar19[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar19[2].order = R;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_698);
    pTVar19 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar19) {
      imageData.m_format = *pTVar19;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
      imageData._0_8_ = &imageData.m_format;
    }
    else {
      imageData.m_format = *pTVar19;
      imageData._0_8_ = (TextureFormat *)*plVar17;
    }
    imageData.m_size.m_data[1] = (int)plVar17[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)pTVar19;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&imageData,(ulong)local_670._M_dataplus._M_p);
    initial.m_data._0_8_ = &local_388;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_388 = (pointer)*plVar22;
      ppSStack_380 = (pointer)plVar17[3];
    }
    else {
      local_388 = (pointer)*plVar22;
      initial.m_data._0_8_ = (long *)*plVar17;
    }
    initial.m_data._8_8_ = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
    local_6b8._M_p = (pointer)&local_6a8;
    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar31) {
      local_6a8._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_6a8._8_8_ = plVar17[3];
    }
    else {
      local_6a8._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_6b8._M_p = (pointer)*plVar17;
    }
    local_6b0 = plVar17[1];
    *plVar17 = (long)paVar31;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pointer *)initial.m_data._0_8_ != &local_388) {
      operator_delete((void *)initial.m_data._0_8_,(long)local_388 + 1);
    }
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    if (local_698 != (TextureFormat)&local_690._M_string_length) {
      operator_delete((void *)local_698,local_690._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
      operator_delete(atomicInvocation._M_dataplus._M_p,
                      atomicInvocation.field_2._M_allocated_capacity + 1);
    }
    pFVar35 = local_6e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
      operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                      shaderImageFormatStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
      operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                      shaderImageTypeStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                      glslVersionDeclaration.field_2._M_allocated_capacity + 1);
    }
    if (local_730 != &local_720) {
      operator_delete(local_730,(long)local_720 + 1);
    }
    if (local_790 != (TextureFormat)&local_780) {
      operator_delete((void *)local_790,(long)local_780 + 1);
    }
    pbVar29 = local_7d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
LAB_014b1757:
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (AVar5 != ATOMIC_OPERATION_EXCHANGE) goto LAB_014b35d0;
    iVar11 = (int)local_7e8._vptr_ImageLayerVerifier;
    iVar10 = local_7e8._vptr_ImageLayerVerifier._4_4_;
    std::operator+(&local_6d8,"((",&local_670);
    pTVar19 = (TextureFormat *)std::__cxx11::string::append((char *)&local_6d8);
    TVar36 = (TextureFormat)(pTVar19 + 2);
    if (*pTVar19 == TVar36) {
      local_780 = *(_func_int ***)TVar36;
      TStack_778 = pTVar19[3];
      local_790 = (TextureFormat)&local_780;
    }
    else {
      local_780 = *(_func_int ***)TVar36;
      local_790 = *pTVar19;
    }
    local_788 = pTVar19[1];
    *pTVar19 = TVar36;
    pTVar19[1].order = R;
    pTVar19[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar19[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar11 * 5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_328);
    pp_Var33 = (_func_int **)0xf;
    if (local_790 != (TextureFormat)&local_780) {
      pp_Var33 = local_780;
    }
    if (pp_Var33 < (_func_int **)(local_700._M_string_length + (long)local_788)) {
      uVar20 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_700._M_dataplus._M_p != &local_700.field_2) {
        uVar20 = local_700.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < (_func_int **)(local_700._M_string_length + (long)local_788))
      goto LAB_014b307b;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,(ulong)local_790);
    }
    else {
LAB_014b307b:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_790,(ulong)local_700._M_dataplus._M_p);
    }
    local_730 = &local_720;
    pppTVar25 = (pointer *)(puVar18 + 2);
    if ((pointer *)*puVar18 == pppTVar25) {
      local_720 = *pppTVar25;
      ppTStack_718 = (pointer)puVar18[3];
    }
    else {
      local_720 = *pppTVar25;
      local_730 = (pointer *)*puVar18;
    }
    local_728 = (pointer)puVar18[1];
    *puVar18 = pppTVar25;
    puVar18[1] = 0;
    *(undefined1 *)pppTVar25 = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_730);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar23;
      glslVersionDeclaration.field_2._8_8_ = plVar17[3];
      glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar23;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar17;
    }
    glslVersionDeclaration._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&glslVersionDeclaration,(ulong)local_610._M_dataplus._M_p);
    shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageTypeStr.field_2._8_8_ = plVar17[3];
    }
    else {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageTypeStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageTypeStr);
    paVar31 = &shaderImageFormatStr.field_2;
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageFormatStr.field_2._8_8_ = plVar17[3];
      shaderImageFormatStr._M_dataplus._M_p = (pointer)paVar31;
    }
    else {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
      shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageFormatStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_328);
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != paVar31) {
      uVar20 = shaderImageFormatStr.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_628 + shaderImageFormatStr._M_string_length) {
      uVar13 = 0xf;
      if (local_630 != &local_620) {
        uVar13 = local_620;
      }
      if (uVar13 < local_628 + shaderImageFormatStr._M_string_length) goto LAB_014b32aa;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_630,0,(char *)0x0,
                           (ulong)shaderImageFormatStr._M_dataplus._M_p);
    }
    else {
LAB_014b32aa:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&shaderImageFormatStr,(ulong)local_630);
    }
    atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
    psVar23 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar23) {
      atomicInvocation.field_2._M_allocated_capacity = *psVar23;
      atomicInvocation.field_2._8_8_ = puVar18[3];
    }
    else {
      atomicInvocation.field_2._M_allocated_capacity = *psVar23;
      atomicInvocation._M_dataplus._M_p = (pointer)*puVar18;
    }
    atomicInvocation._M_string_length = puVar18[1];
    *puVar18 = psVar23;
    puVar18[1] = 0;
    *(char *)psVar23 = '\0';
    pTVar19 = (TextureFormat *)std::__cxx11::string::append((char *)&atomicInvocation);
    TVar36 = (TextureFormat)(pTVar19 + 2);
    if (*pTVar19 == TVar36) {
      local_690._M_string_length = *(size_type *)TVar36;
      local_690.field_2._M_allocated_capacity = (size_type)pTVar19[3];
      local_698 = (TextureFormat)&local_690._M_string_length;
    }
    else {
      local_690._M_string_length = *(size_type *)TVar36;
      local_698 = *pTVar19;
    }
    local_690._M_dataplus._M_p = *(pointer *)(pTVar19 + 1);
    *pTVar19 = TVar36;
    pTVar19[1].order = R;
    pTVar19[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar19[2].order = R;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_650);
    pTVar19 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar19) {
      imageData.m_format = *pTVar19;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
      imageData._0_8_ = &imageData.m_format;
    }
    else {
      imageData.m_format = *pTVar19;
      imageData._0_8_ = (TextureFormat *)*plVar17;
    }
    imageData.m_size.m_data[1] = (int)plVar17[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)pTVar19;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&imageData);
    local_6b8._M_p = (pointer)&local_6a8;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 == paVar26) {
      local_6a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_6a8._8_8_ = puVar18[3];
    }
    else {
      local_6a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_6b8._M_p = (pointer)*puVar18;
    }
    local_6b0 = puVar18[1];
    *puVar18 = paVar26;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    pFVar35 = local_6e0;
    if (local_698 != (TextureFormat)&local_690._M_string_length) {
      operator_delete((void *)local_698,local_690._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
      operator_delete(atomicInvocation._M_dataplus._M_p,
                      atomicInvocation.field_2._M_allocated_capacity + 1);
    }
    if (local_630 != &local_620) {
      operator_delete(local_630,local_620 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != paVar31) {
      operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                      shaderImageFormatStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
      operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                      shaderImageTypeStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                      glslVersionDeclaration.field_2._M_allocated_capacity + 1);
    }
    if (local_730 != &local_720) {
      operator_delete(local_730,(long)local_720 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
    if (local_790 != (TextureFormat)&local_780) {
      operator_delete((void *)local_790,(long)local_780 + 1);
    }
    local_700.field_2._M_allocated_capacity = local_6d8.field_2._M_allocated_capacity;
    local_700._M_dataplus._M_p = local_6d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) goto LAB_014b1757;
  }
  paVar31 = &local_670.field_2;
  sVar16 = strlen(pbVar29);
  isSampler = (undefined1)sVar16;
  plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_6b8,0,(char *)0x0,(ulong)pbVar29);
  atomicArgExpr._M_dataplus._M_p = (pointer)&atomicArgExpr.field_2;
  psVar23 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar23) {
    atomicArgExpr.field_2._M_allocated_capacity = *psVar23;
    atomicArgExpr.field_2._8_8_ = plVar17[3];
  }
  else {
    atomicArgExpr.field_2._M_allocated_capacity = *psVar23;
    atomicArgExpr._M_dataplus._M_p = (pointer)*plVar17;
  }
  atomicArgExpr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_p != &local_6a8) {
    operator_delete(local_6b8._M_p,local_6a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != paVar31) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if (local_650 != (TextureFormat)&local_640) {
    operator_delete((void *)local_650,local_640 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
  glslVersionDeclaration._M_string_length = 0;
  glslVersionDeclaration.field_2._M_allocated_capacity =
       glslVersionDeclaration.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar17 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
  shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
  psVar23 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar23) {
    shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
    shaderImageTypeStr.field_2._8_8_ = plVar17[3];
  }
  else {
    shaderImageTypeStr.field_2._M_allocated_capacity = *psVar23;
    shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
  }
  shaderImageTypeStr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageTypeStr);
  shaderImageFormatStr._M_dataplus._M_p = (pointer)&shaderImageFormatStr.field_2;
  psVar23 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar23) {
    shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
    shaderImageFormatStr.field_2._8_8_ = plVar17[3];
  }
  else {
    shaderImageFormatStr.field_2._M_allocated_capacity = *psVar23;
    shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
  }
  shaderImageFormatStr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  pTVar19 = (TextureFormat *)
            std::__cxx11::string::_M_append
                      ((char *)&shaderImageFormatStr,(ulong)atomicCoord._M_dataplus._M_p);
  TVar36 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar36) {
    local_690._M_string_length = *(size_type *)TVar36;
    local_690.field_2._M_allocated_capacity = (size_type)pTVar19[3];
    local_698 = (TextureFormat)&local_690._M_string_length;
  }
  else {
    local_690._M_string_length = *(size_type *)TVar36;
    local_698 = *pTVar19;
  }
  local_690._M_dataplus._M_p = *(pointer *)(pTVar19 + 1);
  *pTVar19 = TVar36;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar19[2].order = R;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_698);
  pTVar19 = (TextureFormat *)(plVar17 + 2);
  if ((TextureFormat *)*plVar17 == pTVar19) {
    imageData.m_format = *pTVar19;
    imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
    imageData._0_8_ = &imageData.m_format;
  }
  else {
    imageData.m_format = *pTVar19;
    imageData._0_8_ = (TextureFormat *)*plVar17;
  }
  imageData.m_size.m_data[1] = (int)plVar17[1];
  imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
  *plVar17 = (long)pTVar19;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&imageData,(ulong)atomicArgExpr._M_dataplus._M_p);
  initial.m_data._0_8_ = &local_388;
  plVar22 = plVar17 + 2;
  if ((long *)*plVar17 == plVar22) {
    local_388 = (pointer)*plVar22;
    ppSStack_380 = (pointer)plVar17[3];
  }
  else {
    local_388 = (pointer)*plVar22;
    initial.m_data._0_8_ = (long *)*plVar17;
  }
  initial.m_data._8_8_ = plVar17[1];
  *plVar17 = (long)plVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
  atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
  psVar23 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar23) {
    atomicInvocation.field_2._M_allocated_capacity = *psVar23;
    atomicInvocation.field_2._8_8_ = plVar17[3];
  }
  else {
    atomicInvocation.field_2._M_allocated_capacity = *psVar23;
    atomicInvocation._M_dataplus._M_p = (pointer)*plVar17;
  }
  pTVar19 = (TextureFormat *)plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  atomicInvocation._M_string_length = (size_type)pTVar19;
  if ((pointer *)initial.m_data._0_8_ != &local_388) {
    operator_delete((void *)initial.m_data._0_8_,(long)local_388 + 1);
    pTVar19 = extraout_RDX;
  }
  if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
    operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    pTVar19 = extraout_RDX_00;
  }
  TVar30 = local_708;
  if (local_698 != (TextureFormat)&local_690._M_string_length) {
    operator_delete((void *)local_698,local_690._M_string_length + 1);
    pTVar19 = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
    pTVar19 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
    pTVar19 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
    pTVar19 = extraout_RDX_04;
  }
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)local_4d0,pTVar19);
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)*(ChannelType *)((long)TVar30 + 0x7c),
             *(TextureType *)((long)TVar30 + 0x80),TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)pFVar35 + 0x10))(pFVar35);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar28 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar28,(allocator<char> *)&initial);
  local_90[0x10] = 0;
  local_90._17_8_ = 0;
  local_90._0_8_ = (pointer)0x0;
  local_90[8] = 0;
  local_90._9_7_ = 0;
  memset(&imageData,0,0xac);
  local_530 = local_520;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_530,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_530);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_448,pFVar35,renderContext_00);
  uVar13 = 0xf;
  if (local_530 != local_520) {
    uVar13 = local_520[0];
  }
  if (uVar13 < local_448._M_string_length + local_528) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      uVar20 = local_448.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_448._M_string_length + local_528) goto LAB_014b1cb2;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,(ulong)local_530);
  }
  else {
LAB_014b1cb2:
    puVar18 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_448._M_dataplus._M_p);
  }
  local_578 = &local_568;
  renderContext = (RenderContext *)(puVar18 + 2);
  if ((RenderContext *)*puVar18 == renderContext) {
    local_568._vptr_RenderContext = renderContext->_vptr_RenderContext;
    uStack_560 = puVar18[3];
  }
  else {
    local_568._vptr_RenderContext = renderContext->_vptr_RenderContext;
    local_578 = (RenderContext *)*puVar18;
  }
  local_570 = puVar18[1];
  *puVar18 = renderContext;
  puVar18[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_468,(Functional *)(ulong)*(TextureType *)((long)TVar30 + 0x80),
             (TextureType)pFVar35,renderContext);
  RVar32._vptr_RenderContext = (_func_int **)0xf;
  if (local_578 != &local_568) {
    RVar32._vptr_RenderContext = local_568._vptr_RenderContext;
  }
  if (RVar32._vptr_RenderContext < (_func_int **)(local_468._M_string_length + local_570)) {
    uVar20 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      uVar20 = local_468.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < (_func_int **)(local_468._M_string_length + local_570)) goto LAB_014b1d96;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_468,0,(char *)0x0,(ulong)local_578);
  }
  else {
LAB_014b1d96:
    puVar18 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_578,(ulong)local_468._M_dataplus._M_p);
  }
  local_4f0 = &local_4e0;
  plVar17 = puVar18 + 2;
  if ((long *)*puVar18 == plVar17) {
    local_4e0 = *plVar17;
    uStack_4d8 = puVar18[3];
  }
  else {
    local_4e0 = *plVar17;
    local_4f0 = (long *)*puVar18;
  }
  local_4e8 = puVar18[1];
  *puVar18 = plVar17;
  puVar18[1] = 0;
  *(undefined1 *)plVar17 = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  local_428 = &local_418;
  plVar22 = plVar17 + 2;
  if ((long *)*plVar17 == plVar22) {
    local_418 = *plVar22;
    lStack_410 = plVar17[3];
  }
  else {
    local_418 = *plVar22;
    local_428 = (long *)*plVar17;
  }
  local_420 = plVar17[1];
  *plVar17 = (long)plVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_428,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_408 = &local_3f8;
  plVar22 = plVar17 + 2;
  if ((long *)*plVar17 == plVar22) {
    local_3f8 = *plVar22;
    lStack_3f0 = plVar17[3];
  }
  else {
    local_3f8 = *plVar22;
    local_408 = (long *)*plVar17;
  }
  local_400 = plVar17[1];
  *plVar17 = (long)plVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_408);
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 == paVar26) {
    local_670.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_670.field_2._8_8_ = plVar17[3];
    local_670._M_dataplus._M_p = (pointer)paVar31;
  }
  else {
    local_670.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_670._M_dataplus._M_p = (pointer)*plVar17;
  }
  local_670._M_string_length = plVar17[1];
  *plVar17 = (long)paVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  pTVar19 = (TextureFormat *)
            std::__cxx11::string::_M_append
                      ((char *)&local_670,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  TVar36 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar36) {
    local_640 = *(long *)TVar36;
    TStack_638 = pTVar19[3];
    local_650 = (TextureFormat)&local_640;
  }
  else {
    local_640 = *(long *)TVar36;
    local_650 = *pTVar19;
  }
  local_648 = pTVar19[1];
  *pTVar19 = TVar36;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar19[2].order = R;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_650);
  psVar23 = (size_type *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_610.field_2._M_allocated_capacity = *psVar23;
    local_610.field_2._8_8_ = plVar17[3];
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  }
  else {
    local_610.field_2._M_allocated_capacity = *psVar23;
    local_610._M_dataplus._M_p = (pointer)*plVar17;
  }
  local_610._M_string_length = plVar17[1];
  *plVar17 = (long)psVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_610,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_6b8._M_p = (pointer)&local_6a8;
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 == paVar26) {
    local_6a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_6a8._8_8_ = plVar17[3];
  }
  else {
    local_6a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_6b8._M_p = (pointer)*plVar17;
  }
  local_6b0 = plVar17[1];
  *plVar17 = (long)paVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_6b8);
  puVar27 = (ulong *)(plVar17 + 2);
  if ((ulong *)*plVar17 == puVar27) {
    local_620 = *puVar27;
    uStack_618 = (undefined4)plVar17[3];
    uStack_614 = *(undefined4 *)((long)plVar17 + 0x1c);
    local_630 = &local_620;
  }
  else {
    local_620 = *puVar27;
    local_630 = (ulong *)*plVar17;
  }
  local_628 = plVar17[1];
  *plVar17 = (long)puVar27;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  AVar6 = *(AtomicOperationCaseType *)((long)TVar30 + 0x88);
  local_7d8 = (bool *)CONCAT44(local_7d8._4_4_,
                               (int)CONCAT71((int7)((ulong)plVar17 >> 8),
                                             AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES));
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_50,"layout (",&shaderImageFormatStr);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_1b0 = &local_1a0;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_1a0 = *plVar22;
      lStack_198 = plVar17[3];
    }
    else {
      local_1a0 = *plVar22;
      local_1b0 = (long *)*plVar17;
    }
    local_1a8 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)shaderImageTypeStr._M_dataplus._M_p);
    local_190 = &local_180;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_180 = *plVar22;
      lStack_178 = plVar17[3];
    }
    else {
      local_180 = *plVar22;
      local_190 = (long *)*plVar17;
    }
    local_188 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_190);
    local_550 = &local_540;
    puVar27 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar27) {
      local_540 = *puVar27;
      lStack_538 = plVar17[3];
    }
    else {
      local_540 = *puVar27;
      local_550 = (ulong *)*plVar17;
    }
    local_548 = plVar17[1];
    *plVar17 = (long)puVar27;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
  }
  else {
    local_550 = &local_540;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,0x1b3c1e9);
  }
  uVar13 = 0xf;
  if (local_630 != &local_620) {
    uVar13 = local_620;
  }
  if (uVar13 < (ulong)(local_548 + local_628)) {
    uVar13 = 0xf;
    if (local_550 != &local_540) {
      uVar13 = local_540;
    }
    if (uVar13 < (ulong)(local_548 + local_628)) goto LAB_014b2294;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_550,0,(char *)0x0,(ulong)local_630);
  }
  else {
LAB_014b2294:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_630,(ulong)local_550);
  }
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  puVar24 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar24) {
    local_700.field_2._M_allocated_capacity = *puVar24;
    local_700.field_2._8_8_ = puVar18[3];
  }
  else {
    local_700.field_2._M_allocated_capacity = *puVar24;
    local_700._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_700._M_string_length = puVar18[1];
  *puVar18 = puVar24;
  puVar18[1] = 0;
  *(undefined1 *)puVar24 = 0;
  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_700);
  TVar36 = (TextureFormat)&local_6d8.field_2;
  puVar24 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar24) {
    local_6d8.field_2._M_allocated_capacity = *puVar24;
    local_6d8.field_2._8_8_ = puVar18[3];
    local_6d8._M_dataplus._M_p = (pointer)TVar36;
  }
  else {
    local_6d8.field_2._M_allocated_capacity = *puVar24;
    local_6d8._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_6d8._M_string_length = puVar18[1];
  *puVar18 = puVar24;
  puVar18[1] = 0;
  *(undefined1 *)(puVar18 + 2) = 0;
  AVar7 = *(AtomicOperationCaseType *)((long)TVar30 + 0x88);
  pbVar37 = (bool *)(ulong)AVar7;
  if (AVar7 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_70,"\timageStore(u_returnValues, ",&invocationCoord);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_210 = &local_200;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_200 = *plVar22;
      lStack_1f8 = plVar17[3];
    }
    else {
      local_200 = *plVar22;
      local_210 = (long *)*plVar17;
    }
    local_208 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_210,(ulong)colorVecTypeName._M_dataplus._M_p);
    local_1f0 = &local_1e0;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_1e0 = *plVar22;
      lStack_1d8 = plVar17[3];
    }
    else {
      local_1e0 = *plVar22;
      local_1f0 = (long *)*plVar17;
    }
    local_1e8 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1d0 = &local_1c0;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_1c0 = *plVar22;
      lStack_1b8 = plVar17[3];
    }
    else {
      local_1c0 = *plVar22;
      local_1d0 = (long *)*plVar17;
    }
    local_1c8 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1d0,(ulong)atomicInvocation._M_dataplus._M_p);
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    psVar23 = (size_type *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar23) {
      local_510.field_2._M_allocated_capacity = *psVar23;
      local_510.field_2._8_8_ = plVar17[3];
    }
    else {
      local_510.field_2._M_allocated_capacity = *psVar23;
      local_510._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_510._M_string_length = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_510);
  }
  else {
    if (AVar7 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_5b8 = &local_5a8;
      std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_014b35d0:
      local_6b8._M_p = (pointer)&local_6a8;
      uVar20 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if ((Functional *)imageData._0_8_ != pFVar35) {
        operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
      }
      if (local_698 != TVar36) {
        operator_delete((void *)local_698,local_690._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
        operator_delete(atomicInvocation._M_dataplus._M_p,
                        atomicInvocation.field_2._M_allocated_capacity + 1);
      }
      if (local_630 != &local_620) {
        operator_delete(local_630,local_620 + 1);
      }
      if ((bool *)shaderImageFormatStr._M_dataplus._M_p != pbVar37) {
        operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                        shaderImageFormatStr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
        operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                        shaderImageTypeStr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)glslVersionDeclaration._M_dataplus._M_p != paVar31) {
        operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                        glslVersionDeclaration.field_2._M_allocated_capacity + 1);
      }
      if (local_730 != &local_720) {
        operator_delete(local_730,(long)local_720 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_700._M_dataplus._M_p != &local_700.field_2) {
        operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
      }
      if (local_790 != TVar30) {
        operator_delete((void *)local_790,(long)local_780 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
      }
      if (local_650 != (TextureFormat)&local_640) {
        operator_delete((void *)local_650,local_640 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._M_dataplus._M_p != &local_610.field_2) {
        operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
        operator_delete(invocationCoord._M_dataplus._M_p,
                        invocationCoord.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
        operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
        operator_delete(colorVecTypeName._M_dataplus._M_p,
                        colorVecTypeName.field_2._M_allocated_capacity + 1);
      }
      glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
      glu::CallLogWrapper::~CallLogWrapper(&glLog);
      _Unwind_Resume(uVar20);
    }
    std::operator+(&local_510,"\t",&atomicInvocation);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_510);
  }
  local_5b8 = &local_5a8;
  ppp_Var1 = (_func_int ***)(puVar18 + 2);
  if ((_func_int ***)*puVar18 == ppp_Var1) {
    local_5a8 = *ppp_Var1;
    uStack_5a0 = puVar18[3];
  }
  else {
    local_5a8 = *ppp_Var1;
    local_5b8 = (_func_int ***)*puVar18;
  }
  local_5b0 = puVar18[1];
  *puVar18 = ppp_Var1;
  puVar18[1] = 0;
  *(undefined1 *)ppp_Var1 = 0;
  uVar20 = (_func_int **)0xf;
  if ((TextureFormat)local_6d8._M_dataplus._M_p != TVar36) {
    uVar20 = local_6d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (_func_int **)(local_5b0 + local_6d8._M_string_length)) {
    pp_Var33 = (_func_int **)0xf;
    if (local_5b8 != &local_5a8) {
      pp_Var33 = local_5a8;
    }
    if (pp_Var33 < (_func_int **)(local_5b0 + local_6d8._M_string_length)) goto LAB_014b263b;
    pTVar19 = (TextureFormat *)
              std::__cxx11::string::replace
                        ((ulong)&local_5b8,0,(char *)0x0,(ulong)local_6d8._M_dataplus._M_p);
  }
  else {
LAB_014b263b:
    pTVar19 = (TextureFormat *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_5b8);
  }
  local_790 = (TextureFormat)&local_780;
  TVar36 = (TextureFormat)(pTVar19 + 2);
  if (*pTVar19 == TVar36) {
    local_780 = *(_func_int ***)TVar36;
    TStack_778 = pTVar19[3];
  }
  else {
    local_780 = *(_func_int ***)TVar36;
    local_790 = *pTVar19;
  }
  local_788 = pTVar19[1];
  *pTVar19 = TVar36;
  pTVar19[1].order = R;
  pTVar19[1].type = SNORM_INT8;
  *(undefined1 *)TVar36 = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_790);
  pppTVar25 = (pointer *)(plVar17 + 2);
  if ((pointer *)*plVar17 == pppTVar25) {
    local_720 = *pppTVar25;
    ppTStack_718 = (pointer)plVar17[3];
    local_730 = &local_720;
  }
  else {
    local_720 = *pppTVar25;
    local_730 = (pointer *)*plVar17;
  }
  local_728 = (pointer)plVar17[1];
  *plVar17 = (long)pppTVar25;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  local_698.order = RG;
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_690,local_730,(long)local_728 + (long)local_730);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((&imageData.m_size)[((ulong)local_698 & 0xffffffff) * 2 + -1].m_data + 2),
              &local_690);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&initial,(RenderContext *)local_6e0,(ProgramSources *)&imageData);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._0_8_ + 1);
  }
  pFVar35 = local_6e0;
  if (local_730 != &local_720) {
    operator_delete(local_730,(long)local_720 + 1);
  }
  if (local_790 != (TextureFormat)&local_780) {
    operator_delete((void *)local_790,(long)local_780 + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,(long)local_5a8 + 1);
  }
  if (AVar7 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
    }
    if (AVar7 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) goto LAB_014b28da;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_014b28da:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550,local_540 + 1);
  }
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_630 != &local_620) {
    operator_delete(local_630,local_620 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_p != &local_6a8) {
    operator_delete(local_6b8._M_p,local_6a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if (local_650 != (TextureFormat)&local_640) {
    operator_delete((void *)local_650,local_640 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,local_418 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,(long)local_568._vptr_RenderContext + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_530 != local_520) {
    operator_delete(local_530,local_520[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_b0);
  lVar21 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)imageData.m_size.m_data + lVar21 + -4));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  uVar20 = (**(code **)(*(long *)pFVar35 + 0x18))(pFVar35);
  TVar36 = local_708;
  imageData.m_tex2D.m_state = (SharedPtrStateBase *)&imageData.m_texBuffer.m_state;
  imageData.m_type = (TextureType)uVar20;
  imageData.m_size.m_data[0] = (int)((ulong)uVar20 >> 0x20);
  imageData.m_size.m_data[1] = (int)local_710;
  imageData.m_size.m_data[2] = (int)((ulong)local_710 >> 0x20);
  imageData.m_format.order = local_300;
  imageData.m_texBuffer.m_state._0_4_ = 0;
  imageData.m_tex2D.m_ptr = (Texture2D *)0x0;
  imageData.m_texCube.m_state = (SharedPtrStateBase *)0x0;
  imageData.m_texCube.m_ptr = (TextureCube *)imageData.m_tex2D.m_state;
  glu::operator<<((TestLog *)local_710,(ShaderProgram *)&initial);
  if (local_2d8 == false) {
    tcu::TestContext::setTestResult
              (*(TestContext **)((long)TVar36 + 8),QP_TEST_RESULT_FAIL,"Program compilation failed")
    ;
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_300);
    glu::CallLogWrapper::glDispatchCompute
              (&glLog,(int)local_7e8._vptr_ImageLayerVerifier * 5,
               local_7e8._vptr_ImageLayerVerifier._4_4_,num_groups_z);
    lVar21 = (**(code **)(*(long *)pFVar35 + 0x18))(pFVar35);
    dVar12 = (**(code **)(lVar21 + 0x800))();
    glu::checkError(dVar12,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x810);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&imageData.m_texBuffer);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&initial);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
    operator_delete(atomicInvocation._M_dataplus._M_p,
                    atomicInvocation.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicArgExpr._M_dataplus._M_p != &atomicArgExpr.field_2) {
    operator_delete(atomicArgExpr._M_dataplus._M_p,atomicArgExpr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
    operator_delete(invocationCoord._M_dataplus._M_p,
                    invocationCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
    operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
    operator_delete(colorVecTypeName._M_dataplus._M_p,
                    colorVecTypeName.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != false) {
    AVar6 = *(AtomicOperationCaseType *)((long)TVar36 + 0x88);
    dVar12 = returnValueTexture.super_ObjectWrapper.m_object;
    if ((AVar6 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) &&
       (dVar12 = 0xffffffff, AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT)) {
      dVar12 = endResultTexture.super_ObjectWrapper.m_object;
    }
    dVar34 = returnValueTextureBuf.super_ObjectWrapper.m_object;
    if ((AVar6 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) &&
       (dVar34 = 0xffffffff, AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT)) {
      dVar34 = endResultTextureBuf.super_ObjectWrapper.m_object;
    }
    imageData.m_type = (uint)(AVar6 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) * 4 + TEXTURETYPE_CUBE
    ;
    imageData.m_size.m_data[0] = 1;
    imageData.m_size.m_data[1] = 1;
    initial.m_data[0] = 0;
    initial.m_data[1] = 0;
    initial.m_data._8_8_ = initial.m_data._8_8_ & 0xffffffff00000000;
    lVar21 = 0;
    do {
      initial.m_data[lVar21] =
           imageData.m_size.m_data[lVar21 + -1] *
           *(int *)((long)&local_7e8._vptr_ImageLayerVerifier + lVar21 * 4);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      pp_Var33 = *(_func_int ***)((long)TVar36 + 0x80);
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___021a9b20;
      verifyLayer[1]._vptr_ImageLayerVerifier =
           (_func_int **)((long)pp_Var33 << 0x20 | (ulong)pp_Var33 >> 0x20);
    }
    else if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x18);
      pp_Var33 = *(_func_int ***)((long)TVar36 + 0x80);
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___021a9b60;
      verifyLayer[1]._vptr_ImageLayerVerifier =
           (_func_int **)((long)pp_Var33 << 0x20 | (ulong)pp_Var33 >> 0x20);
      verifyLayer[2]._vptr_ImageLayerVerifier = local_7e8._vptr_ImageLayerVerifier;
    }
    else {
      verifyLayer = (ImageLayerVerifier *)0x0;
    }
    bVar38 = readTextureAndVerify
                       ((RenderContext *)local_6e0,&glLog,dVar12,dVar34,
                        *(TextureType *)((long)TVar36 + 0x80),local_4d0,(IVec3 *)&initial,
                        verifyLayer);
    pcVar28 = "Image verification failed";
    if (bVar38) {
      pcVar28 = "Pass";
    }
    tcu::TestContext::setTestResult(*(TestContext **)((long)TVar36 + 8),(uint)!bVar38,pcVar28);
    (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
  }
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

BinaryAtomicOperationCase::IterateResult BinaryAtomicOperationCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			const IVec4 initial(getOperationInitialValue(m_operation));

			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, initial);
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern (initial value " << getOperationInitialValue(m_operation) << ")" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform image stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string atomicArgExpr			= (isUintFormat		? "uint"
											 : isIntFormat		? ""
											 : "float")
												+ getAtomicFuncArgumentShaderStr(m_operation, "gx", "gy", "gz", IVec2(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y()));
		const string atomicInvocation		= string() + getAtomicOperationShaderFuncName(m_operation) + "(u_results, " + atomicCoord + ", " + atomicArgExpr + ")";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(" + atomicInvocation + "));\n"
														 : m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ?
															"	" + atomicInvocation + ";\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and check.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;
		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		const IVec3									textureToCheckSize	= imageSize * IVec3(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ? 1 : NUM_INVOCATIONS_PER_PIXEL, 1, 1);
		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_operation, m_imageType)
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_operation, m_imageType, imageSize.swizzle(0, 1))
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, textureToCheckSize, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}